

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O2

float vera::distance(vec3 *_point,Line *_line,vec3 *_closes_point)

{
  vec<3,_float,_(glm::qualifier)0> *v1;
  float fVar1;
  float fVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vec<3,_float,_(glm::qualifier)0> vVar3;
  vec<3,_float,_(glm::qualifier)0> vVar4;
  vec3 dx;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_68;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_64;
  vec<3,_float,_(glm::qualifier)0> local_58;
  undefined1 local_48 [16];
  vec<3,_float,_(glm::qualifier)0> local_38;
  
  local_38.field_2 = (_line->m_direction).field_2;
  local_38.field_0 = (_line->m_direction).field_0;
  local_38.field_1 = (_line->m_direction).field_1;
  fVar1 = Line::getMagintude2(_line);
  v1 = _line->m_points + 1;
  vVar3 = glm::operator-(v1,_point);
  local_58.field_2 = vVar3.field_2;
  local_58._0_8_ = vVar3._0_8_;
  fVar2 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                    (&local_58,&local_38);
  fVar2 = fVar2 / fVar1;
  fVar1 = 0.0;
  if ((0.0 <= fVar2) && (fVar1 = fVar2, 1.0 < fVar2)) {
    fVar1 = 1.0;
  }
  vVar3 = glm::operator*(fVar1,_line->m_points);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = vVar3._0_8_;
  local_48._12_4_ = extraout_XMM0_Dd;
  vVar4 = glm::operator*(1.0 - fVar1,v1);
  _closes_point->field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
       (vVar4.field_0.x + (float)local_48._0_4_);
  _closes_point->field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (vVar4.field_1.y + (float)local_48._4_4_);
  (_closes_point->field_2).z = vVar4.field_2.z + vVar3.field_2.z;
  vVar3 = glm::operator*(fVar1,_line->m_points);
  vVar4 = glm::operator*(1.0 - fVar1,v1);
  local_68 = vVar3.field_0;
  aStack_64 = vVar3.field_1;
  local_58.field_2.z = vVar4.field_2.z + vVar3.field_2.z;
  local_58.field_1.y = vVar4.field_1.y + aStack_64.y;
  local_58.field_0.x = vVar4.field_0.x + local_68.x;
  fVar1 = glm::detail::compute_distance<3,_float,_(glm::qualifier)0,_false>::call(_point,&local_58);
  return fVar1;
}

Assistant:

float distance(const glm::vec3& _point, const Line& _line, glm::vec3& _closes_point) {
   glm::vec3 dx = _line.getDireciton();
   float m2 = _line.getMagintude2();

   // find parameter value of closest point on segment
   float s12 = glm::dot(_line[1]-_point, dx) / m2;

   if (s12 < 0)
      s12 = 0;
   else if(s12 > 1)
      s12 = 1;
   
   // and find the distance
   _closes_point = s12 * _line[0] + (1.0f - s12) * _line[1];
   return glm::distance(_point, s12 * _line[0] + (1.0f - s12) * _line[1]);
}